

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

int __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::
AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B> *this,
          string *instantiation_name,GeneratorCreationFunc *func,ParamNameGeneratorFunc *name_func,
          char *file,int line)

{
  vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::InstantiationInfo>_>
  *this_00;
  long in_RDI;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  GeneratorCreationFunc *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  InstantiationInfo *in_stack_ffffffffffffff90;
  
  this_00 = (vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::InstantiationInfo>_>
             *)(in_RDI + 0x68);
  InstantiationInfo::InstantiationInfo
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (ParamNameGeneratorFunc *)&stack0xffffffffffffff90,(char *)this_00,
             in_stack_ffffffffffffff6c);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::InstantiationInfo>_>
  ::push_back(this_00,(value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  InstantiationInfo::~InstantiationInfo((InstantiationInfo *)0xa75ab8);
  return 0;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }